

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O1

int mac_ctrl_grasshopper(EVP_PKEY *pkey,int op,long arg1,void *arg2)

{
  int iVar1;
  
  iVar1 = -2;
  if (arg2 != (void *)0x0 && op == 3) {
    *(undefined4 *)arg2 = 0x3f9;
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int mac_ctrl_grasshopper(EVP_PKEY *pkey, int op, long arg1, void *arg2)
{
    switch (op) {
    case ASN1_PKEY_CTRL_DEFAULT_MD_NID:
        if (arg2) {
            *(int *)arg2 = NID_grasshopper_mac;
            return 2;
        }
    }
    return -2;
}